

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darBalance.c
# Opt level: O3

int Aig_BaseSize(Aig_Man_t *p,Aig_Obj_t *pObj,int nLutSize)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  
  uVar1 = *(undefined8 *)&((Aig_Obj_t *)((ulong)pObj & 0xfffffffffffffffe))->field_0x18;
  iVar3 = 0;
  if ((((uint)uVar1 & 7) != 1) &&
     (iVar3 = 1, (int)((uint)((ulong)uVar1 >> 0x20) & 0xffffff) < nLutSize)) {
    iVar2 = Aig_SupportSize(p,(Aig_Obj_t *)((ulong)pObj & 0xfffffffffffffffe));
    iVar3 = 1;
    if (iVar2 < nLutSize) {
      iVar3 = iVar2;
    }
  }
  return iVar3;
}

Assistant:

int Aig_BaseSize( Aig_Man_t * p, Aig_Obj_t * pObj, int nLutSize )
{
    int nBaseSize;
    pObj = Aig_Regular(pObj);
    if ( Aig_ObjIsConst1(pObj) )
        return 0;
    if ( Aig_ObjLevel(pObj) >= nLutSize )
        return 1;
    nBaseSize = Aig_SupportSize( p, pObj );
    if ( nBaseSize >= nLutSize )
        return 1;
    return nBaseSize;
}